

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O3

uint Jupiter_strtoui_nospace(char *str,int base)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  
  if (*str == '+') {
    str = str + 1;
  }
  else if (*str == '-') {
    uVar2 = Jupiter_strtoi_nospace(str,base);
    return uVar2;
  }
  pbVar3 = (byte *)str;
  if (base == 0x10) {
    base = 0x10;
    if (*str == 0x30) {
      if ((((byte *)str)[1] | 0x20) == 0x78) {
        pbVar3 = (byte *)str + 2;
      }
      else {
        pbVar3 = (byte *)str + 1;
      }
    }
    goto LAB_00127dc4;
  }
  if ((base != 0) || (base = 10, *str != 0x30)) goto LAB_00127dc4;
  pbVar3 = (byte *)str + 1;
  bVar1 = ((byte *)str)[1];
  base = 8;
  if (bVar1 < 0x62) {
    if (bVar1 == 0x42) {
LAB_00127db3:
      base = 2;
      pbVar3 = (byte *)str + 2;
      goto LAB_00127dc4;
    }
    if (bVar1 != 0x58) goto LAB_00127dc4;
  }
  else {
    if (bVar1 == 0x62) goto LAB_00127db3;
    if (bVar1 != 0x78) goto LAB_00127dc4;
  }
  base = 0x10;
  pbVar3 = (byte *)str + 2;
LAB_00127dc4:
  uVar4 = (uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                [*pbVar3];
  uVar2 = 0;
  if ((int)(uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                 [*pbVar3] < base) {
    uVar2 = 0;
    do {
      pbVar3 = pbVar3 + 1;
      uVar2 = uVar2 * base + uVar4;
      uVar4 = (uint)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                    [*pbVar3];
    } while (uVar4 < (uint)base);
  }
  return uVar2;
}

Assistant:

unsigned int Jupiter_strtoui_nospace(const char *str, int base)
{
	unsigned int total = 0;
	int tval;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
		++str;

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			switch (*++str)
			{
			case 'X':
			case 'x':
				++str;
				base = 16;
				break;
			case 'B':
			case 'b':
				++str;
				base = 2;
				break;
			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			++str;
			if (*str == 'x' || *str == 'X')
				++str;
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	return total;
}